

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse(parser_t<comments_skipper_t> *this)

{
  bool bVar1;
  parser_t<comments_skipper_t> *this_local;
  
  events_aggregator_t::start_document(&this->handler->super_events_aggregator_t);
  parse_expression(this);
  while( true ) {
    bVar1 = input_stream_t::eof(&this->input);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    parse_new_line(this);
    parse_expression(this);
  }
  events_aggregator_t::finish_document(&this->handler->super_events_aggregator_t);
  return;
}

Assistant:

void parse() {
        handler.start_document();

        parse_expression();

        while (!input.eof()) {
            parse_new_line();
            parse_expression();
        }

        handler.finish_document();
    }